

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

int prvTidyDecodeUTF8BytesToChar
              (uint *c,uint firstByte,ctmbstr successorBytes,TidyInputSource *inp,int *count)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Bool BVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int tempCount;
  byte bVar11;
  byte *pbVar12;
  byte tempbuf [10];
  
  pbVar12 = (byte *)successorBytes;
  if (successorBytes == (ctmbstr)0x0) {
    pbVar12 = tempbuf;
  }
  if (firstByte == 0xffffffff) {
    *c = 0xffffffff;
    *count = 1;
    return 0;
  }
  uVar8 = 1;
  uVar9 = firstByte;
  if (firstByte < 0x80) {
    bVar2 = true;
    bVar1 = false;
  }
  else {
    if ((firstByte & 0xe0) == 0xc0) {
      uVar9 = firstByte & 0x1f;
      uVar8 = 2;
    }
    else if ((firstByte & 0xf0) == 0xe0) {
      uVar9 = firstByte & 0xf;
      uVar8 = 3;
    }
    else {
      if ((firstByte & 0xf8) != 0xf0) {
        if ((firstByte & 0xfc) == 0xf8) {
          uVar9 = firstByte & 3;
          uVar8 = 5;
LAB_0014e755:
          bVar1 = true;
        }
        else {
          if ((firstByte & 0xfe) == 0xfc) {
            uVar9 = firstByte & 1;
            uVar8 = 6;
            goto LAB_0014e755;
          }
          bVar1 = false;
        }
        bVar2 = false;
        goto LAB_0014e564;
      }
      uVar9 = firstByte & 7;
      uVar8 = 4;
    }
    bVar1 = true;
    bVar2 = true;
  }
LAB_0014e564:
  if (successorBytes == (ctmbstr)0x0) {
    if (inp == (TidyInputSource *)0x0) {
      uVar3 = 1;
      uVar8 = 1;
      if (bVar1) goto LAB_0014e70e;
    }
    else {
      uVar6 = 0;
      while ((uVar8 - 1 != uVar6 && (BVar4 = (*inp->eof)(inp->sourceData), BVar4 == no))) {
        uVar5 = (*inp->getByte)(inp->sourceData);
        pbVar12[uVar6] = (byte)uVar5;
        if ((uVar5 & 0xc0) != 0x80) {
          uVar3 = (int)uVar6 + 1;
          if (uVar5 != 0xffffffff) {
            (*inp->ungetByte)(inp->sourceData,(byte)uVar5);
          }
          goto LAB_0014e70e;
        }
        uVar9 = uVar9 << 6 | uVar5 & 0x3f;
        uVar6 = uVar6 + 1;
      }
    }
  }
  else {
    for (uVar6 = 0; uVar8 - 1 != uVar6; uVar6 = uVar6 + 1) {
      bVar11 = pbVar12[uVar6];
      if ((bVar11 == 0) || ((bVar11 & 0xffffffc0) != 0x80)) {
        uVar3 = (int)uVar6 + 1;
        goto LAB_0014e70e;
      }
      uVar9 = uVar9 << 6 | bVar11 & 0x3f;
    }
  }
  uVar3 = uVar8;
  if ((bVar2) && (uVar9 < 0x110000 && (uVar9 & 0xfffffffe) != 0xfffe)) {
    lVar7 = (long)offsetUTF8Sequences[uVar3 - 1];
    if (validUTF8[lVar7].lowChar <= uVar9) {
      if (uVar9 <= (uint)offsetUTF8Sequences[(long)offsetUTF8Sequences[uVar3] * 5 + 4]) {
        pbVar12 = tempbuf;
        if (successorBytes != (ctmbstr)0x0) {
          pbVar12 = (byte *)successorBytes;
        }
        lVar10 = lVar7 * 0x14 + 0x18689d;
        bVar1 = true;
        do {
          if (offsetUTF8Sequences[uVar3] <= lVar7) {
            *count = uVar3;
            *c = uVar9;
            return -(uint)bVar1;
          }
          for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
            bVar11 = (byte)firstByte;
            if (uVar6 != 0) {
              bVar11 = pbVar12[uVar6 - 1];
            }
            if (bVar11 < *(byte *)(lVar10 + -1 + uVar6 * 2)) {
              if (bVar1) {
LAB_0014e6e4:
                bVar1 = true;
                break;
              }
            }
            else if (bVar1 && *(byte *)(lVar10 + uVar6 * 2) < bVar11) goto LAB_0014e6e4;
            bVar1 = false;
          }
          lVar7 = lVar7 + 1;
          lVar10 = lVar10 + 0x14;
        } while( true );
      }
    }
  }
LAB_0014e70e:
  *count = uVar3;
  *c = uVar9;
  return -1;
}

Assistant:

int TY_(DecodeUTF8BytesToChar)( uint* c, uint firstByte, ctmbstr successorBytes,
                                TidyInputSource* inp, int* count )
{
    byte tempbuf[10];
    byte *buf = &tempbuf[0];
    uint ch = 0, n = 0;
    int i, bytes = 0;
    Bool hasError = no;
    
    if ( successorBytes )
        buf = (byte*) successorBytes;
        
    /* special check if we have been passed an EOF char */
    if ( firstByte == EndOfStream )
    {
        /* at present */
        *c = firstByte;
        *count = 1;
        return 0;
    }

    ch = firstByte; /* first byte is passed in separately */
    
    if (ch <= 0x7F) /* 0XXX XXXX one byte */
    {
        n = ch;
        bytes = 1;
    }
    else if ((ch & 0xE0) == 0xC0)  /* 110X XXXX  two bytes */
    {
        n = ch & 31;
        bytes = 2;
    }
    else if ((ch & 0xF0) == 0xE0)  /* 1110 XXXX  three bytes */
    {
        n = ch & 15;
        bytes = 3;
    }
    else if ((ch & 0xF8) == 0xF0)  /* 1111 0XXX  four bytes */
    {
        n = ch & 7;
        bytes = 4;
    }
    else if ((ch & 0xFC) == 0xF8)  /* 1111 10XX  five bytes */
    {
        n = ch & 3;
        bytes = 5;
        hasError = yes;
    }
    else if ((ch & 0xFE) == 0xFC)  /* 1111 110X  six bytes */
    {
        n = ch & 1;
        bytes = 6;
        hasError = yes;
    }
    else
    {
        /* not a valid first byte of a UTF-8 sequence */
        n = ch;
        bytes = 1;
        hasError = yes;
    }

    /* successor bytes should have the form 10XX XXXX */

    /* If caller supplied buffer, use it.  Else see if caller
    ** supplied an input source, use that.
    */
    if ( successorBytes )
    {
        for ( i=0; i < bytes-1; ++i )
        {
            if ( !buf[i] || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( inp )
    {
        for ( i=0; i < bytes-1 && !inp->eof(inp->sourceData); ++i )
        {
            int b = inp->getByte( inp->sourceData );
            buf[i] = (tmbchar) b;

            /* End of data or illegal successor byte value */
            if ( b == EOF || (buf[i] & 0xC0) != 0x80 )
            {
                hasError = yes;
                bytes = i+1;
                if ( b != EOF )
                    inp->ungetByte( inp->sourceData, buf[i] );
                break;
            }
            n = (n << 6) | (buf[i] & 0x3F);
        }
    }
    else if ( bytes > 1 )
    {
        hasError = yes;
        bytes = 1;
    }
    
    if (!hasError && ((n == kUTF8ByteSwapNotAChar) || (n == kUTF8NotAChar)))
        hasError = yes;
        
    if (!hasError && (n > kMaxUTF8FromUCS4))
        hasError = yes;

    if (!hasError)
    {
        int lo, hi;
        
        lo = offsetUTF8Sequences[bytes - 1];
        hi = offsetUTF8Sequences[bytes] - 1;
        
        /* check for overlong sequences */
        if ((n < validUTF8[lo].lowChar) || (n > validUTF8[hi].highChar))
            hasError = yes;
        else
        {
            hasError = yes; /* assume error until proven otherwise */
        
            for (i = lo; i <= hi; i++)
            {
                int tempCount;
                byte theByte;
                
                for (tempCount = 0; tempCount < bytes; tempCount++)
                {
                    if (!tempCount)
                        theByte = (tmbchar) firstByte;
                    else
                        theByte = buf[tempCount - 1];
                        
                    if ( theByte >= validUTF8[i].validBytes[(tempCount * 2)] &&
                         theByte <= validUTF8[i].validBytes[(tempCount * 2) + 1] )
                        hasError = no;
                    if (hasError)
                        break;
                }
            }
        }
    }

#if 1 && defined(_DEBUG)
    if ( hasError )
    {
       /* debug */
       fprintf( stderr, "UTF-8 decoding error of %d bytes : ", bytes );
       fprintf( stderr, "0x%02x ", firstByte );
       for (i = 1; i < bytes; i++)
           fprintf( stderr, "0x%02x ", buf[i - 1] );
       fprintf( stderr, " = U+%04X\n", n );
    }
#endif

    *count = bytes;
    *c = n;
    if ( hasError )
        return -1;
    return 0;
}